

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType nValence,RealType nMobile,
          DoublePolynomial *vs)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_b8 [40];
  RealType local_90;
  undefined2 local_88;
  RealType local_80;
  RealType local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_58;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_50;
  
  bVar1 = isFluctuatingCharge(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::FQtypeID_abi_cxx11_);
  }
  local_58 = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = 1;
  local_90 = chargeMass;
  local_80 = nValence;
  local_78 = nMobile;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=(&local_50,
              (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)vs);
  this_00 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (FluctuatingAtypeParameters *)OpenMD::FQtypeID_abi_cxx11_);
  local_b8._16_8_ = local_b8._0_8_;
  local_b8._24_8_ = local_b8._8_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_b8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(RealType chargeMass,
                                                       RealType nValence,
                                                       RealType nMobile,
                                                       DoublePolynomial vs) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};

    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = false;
    fqParam.isMetallic               = true;
    fqParam.nValence                 = nValence;
    fqParam.nMobile                  = nMobile;

    fqParam.vself = vs;

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }